

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomCommunicationParameters.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::IntercomCommunicationParameters::SetRecord
          (IntercomCommunicationParameters *this,EntityDestinationRecord *EDR)

{
  if (EDR != (EntityDestinationRecord *)0x0) {
    if ((this->m_pRecord != (DataTypeBase *)0x0) && (this->m_bMemoryManage == true)) {
      (*this->m_pRecord->_vptr_DataTypeBase[1])();
    }
    this->m_bMemoryManage = false;
    this->m_ui16Type = 1;
    this->m_ui16Length = 0xc;
    this->m_pRecord = &EDR->super_DataTypeBase;
  }
  return;
}

Assistant:

void IntercomCommunicationParameters::SetRecord( EntityDestinationRecord * EDR )
{
    if( !EDR )return;

    if( m_pRecord && m_bMemoryManage )delete m_pRecord;

    m_bMemoryManage = false;

    m_ui16Length = EntityDestinationRecord::ENTITY_DESTINATION_RECORD_SIZE;

    m_ui16Type = EntityDestinationRecord_Type;

    m_pRecord = EDR;
}